

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O2

int open_socket(char *host,unsigned_short port)

{
  int __fd;
  int iVar1;
  hostent *phVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *prVar6;
  char *local_1d8 [4];
  sockaddr_in far_end;
  stringstream msg;
  ostream local_198 [376];
  
  phVar2 = gethostbyname(host);
  if (phVar2 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar3 = std::operator<<(local_198,"gethostbyname(");
    poVar3 = std::operator<<(poVar3,host);
    poVar3 = std::operator<<(poVar3,"): ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)local_1d8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_1d8);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1d8[0]);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __fd = socket(2,1,0);
  if (__fd != -1) {
    far_end.sin_family = 2;
    far_end.sin_port = port << 8 | port >> 8;
    far_end.sin_addr.s_addr = *(in_addr_t *)*phVar2->h_addr_list;
    far_end.sin_zero[0] = '\0';
    far_end.sin_zero[1] = '\0';
    far_end.sin_zero[2] = '\0';
    far_end.sin_zero[3] = '\0';
    far_end.sin_zero[4] = '\0';
    far_end.sin_zero[5] = '\0';
    far_end.sin_zero[6] = '\0';
    far_end.sin_zero[7] = '\0';
    iVar1 = connect(__fd,(sockaddr *)&far_end,0x10);
    if (iVar1 != -1) {
      return __fd;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar3 = std::operator<<(local_198,"connect(");
    poVar3 = std::operator<<(poVar3,host);
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,port);
    poVar3 = std::operator<<(poVar3,"): ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)local_1d8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_1d8);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1d8[0]);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar3 = std::operator<<(local_198,"socket: ");
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  std::operator<<(poVar3,pcVar5);
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)local_1d8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)local_1d8);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,local_1d8[0]);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int open_socket(const char* host, unsigned short port)
{
  hostent* he;
  he = gethostbyname(host);

  if (he == nullptr)
  {
    stringstream msg;
    msg << "gethostbyname(" << host << "): " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  int sd = socket(PF_INET, SOCK_STREAM, 0);
  if (sd == -1)
  {
    stringstream msg;
    msg << "socket: " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = htons(port);
  far_end.sin_addr = *(in_addr*)(he->h_addr);
  memset(&far_end.sin_zero, '\0', 8);
  if (connect(sd, (sockaddr*)&far_end, sizeof(far_end)) == -1)
  {
    stringstream msg;
    msg << "connect(" << host << ':' << port << "): " << strerror(errno);
    cerr << msg.str() << endl;
    throw runtime_error(msg.str().c_str());
  }
  return sd;
}